

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O0

void __thiscall CProfileIterator::Enter_Child(CProfileIterator *this,int index)

{
  CProfileNode *pCVar1;
  int in_ESI;
  undefined8 *in_RDI;
  int local_c;
  
  pCVar1 = CProfileNode::Get_Child((CProfileNode *)*in_RDI);
  in_RDI[1] = pCVar1;
  local_c = in_ESI;
  while (in_RDI[1] != 0 && local_c != 0) {
    local_c = local_c + -1;
    pCVar1 = CProfileNode::Get_Sibling((CProfileNode *)in_RDI[1]);
    in_RDI[1] = pCVar1;
  }
  if (in_RDI[1] != 0) {
    *in_RDI = in_RDI[1];
    pCVar1 = CProfileNode::Get_Child((CProfileNode *)*in_RDI);
    in_RDI[1] = pCVar1;
  }
  return;
}

Assistant:

void	CProfileIterator::Enter_Child( int index )
{
	CurrentChild = CurrentParent->Get_Child();
	while ( (CurrentChild != NULL) && (index != 0) ) {
		index--;
		CurrentChild = CurrentChild->Get_Sibling();
	}

	if ( CurrentChild != NULL ) {
		CurrentParent = CurrentChild;
		CurrentChild = CurrentParent->Get_Child();
	}
}